

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

App * __thiscall
CLI::App::add_subcommand(App *this,string *subcommand_name,string *subcommand_description)

{
  bool bVar1;
  reference pvVar2;
  undefined8 uVar3;
  reference pcVar4;
  App *pAVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  App_p subcom;
  char c;
  iterator __end2;
  iterator __begin2;
  string *__range2;
  App *in_stack_fffffffffffffe68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  shared_ptr<CLI::App> local_140;
  undefined1 local_129;
  string *in_stack_fffffffffffffed8;
  IncorrectConstruction *in_stack_fffffffffffffee0;
  App_p *in_stack_ffffffffffffff08;
  App *in_stack_ffffffffffffff10;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60 [2];
  undefined1 local_4d;
  App *in_stack_ffffffffffffffb8;
  string *in_stack_ffffffffffffffc0;
  string *in_stack_ffffffffffffffc8;
  App *in_stack_ffffffffffffffd0;
  
  __str = in_RSI;
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x18cea8);
  if ((!bVar1) && (bVar1 = CLI::detail::valid_name_string(in_stack_fffffffffffffe78), !bVar1)) {
    pvVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[](in_stack_fffffffffffffe70,(size_type)in_stack_fffffffffffffe68);
    bVar1 = CLI::detail::valid_first_char<char>(*pvVar2);
    if (!bVar1) {
      local_4d = 1;
      uVar3 = __cxa_allocate_exception(0x38);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                (in_RDX,(char *)__str,(allocator<char> *)in_RSI);
      IncorrectConstruction::IncorrectConstruction
                (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      local_4d = 0;
      __cxa_throw(uVar3,&IncorrectConstruction::typeinfo,
                  IncorrectConstruction::~IncorrectConstruction);
    }
    local_60[0]._M_current =
         (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 begin((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffe68);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
              (in_stack_fffffffffffffe78);
    while (bVar1 = __gnu_cxx::
                   operator==<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)in_stack_fffffffffffffe70,
                              (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)in_stack_fffffffffffffe68), ((bVar1 ^ 0xffU) & 1) != 0) {
      pcVar4 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(local_60);
      bVar1 = CLI::detail::valid_later_char<char>(*pcVar4);
      if (!bVar1) {
        uVar3 = __cxa_allocate_exception(0x38);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string<std::allocator<char>>
                  (in_RDX,(char *)__str,(allocator<char> *)in_RSI);
        ::std::operator+(in_stack_fffffffffffffe78,(char)((ulong)in_stack_fffffffffffffe70 >> 0x38))
        ;
        ::std::operator+(in_stack_fffffffffffffe78,(char *)in_stack_fffffffffffffe70);
        IncorrectConstruction::IncorrectConstruction
                  (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
        __cxa_throw(uVar3,&IncorrectConstruction::typeinfo,
                    IncorrectConstruction::~IncorrectConstruction);
      }
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(local_60);
    }
  }
  operator_new(0x360);
  local_129 = 1;
  ::std::__cxx11::string::string(in_RDX,__str);
  ::std::__cxx11::string::string(in_RDX,__str);
  App(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
      in_stack_ffffffffffffffb8);
  local_129 = 0;
  ::std::shared_ptr<CLI::App>::shared_ptr<CLI::App,void>
            ((shared_ptr<CLI::App> *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  ::std::__cxx11::string::~string(in_stack_fffffffffffffe70);
  ::std::__cxx11::string::~string(in_stack_fffffffffffffe70);
  std::shared_ptr<CLI::App>::shared_ptr
            ((shared_ptr<CLI::App> *)in_stack_fffffffffffffe70,&local_140);
  pAVar5 = add_subcommand(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  std::shared_ptr<CLI::App>::~shared_ptr((shared_ptr<CLI::App> *)0x18d26d);
  std::shared_ptr<CLI::App>::~shared_ptr((shared_ptr<CLI::App> *)0x18d27a);
  return pAVar5;
}

Assistant:

CLI11_INLINE App *App::add_subcommand(std::string subcommand_name, std::string subcommand_description) {
    if(!subcommand_name.empty() && !detail::valid_name_string(subcommand_name)) {
        if(!detail::valid_first_char(subcommand_name[0])) {
            throw IncorrectConstruction(
                "Subcommand name starts with invalid character, '!' and '-' and control characters");
        }
        for(auto c : subcommand_name) {
            if(!detail::valid_later_char(c)) {
                throw IncorrectConstruction(std::string("Subcommand name contains invalid character ('") + c +
                                            "'), all characters are allowed except"
                                            "'=',':','{','}', ' ', and control characters");
            }
        }
    }
    CLI::App_p subcom = std::shared_ptr<App>(new App(std::move(subcommand_description), subcommand_name, this));
    return add_subcommand(std::move(subcom));
}